

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O0

void __thiscall
ON_PolynomialCurve::ON_PolynomialCurve(ON_PolynomialCurve *this,ON_PolynomialCurve *src)

{
  ON_PolynomialCurve *src_local;
  ON_PolynomialCurve *this_local;
  
  this->m_dim = 0;
  this->m_is_rat = 0;
  this->m_order = 0;
  ON_4dPointArray::ON_4dPointArray(&this->m_cv);
  ON_Interval::ON_Interval(&this->m_domain,0.0,1.0);
  operator=(this,src);
  return;
}

Assistant:

ON_PolynomialCurve::ON_PolynomialCurve(const ON_PolynomialCurve& src)
                   : m_dim(0), m_is_rat(0), m_order(0), m_domain(0.0,1.0)
{
  *this = src;
}